

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_null_callback(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uv_loop_t *unaff_RBX;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t handle;
  uv_timer_t uStack_1c8;
  uv_loop_t *puStack_150;
  uint64_t uStack_140;
  code *pcStack_138;
  long lStack_128;
  long lStack_120;
  uv_timer_t uStack_118;
  uv_loop_t *puStack_a0;
  long local_90;
  long local_88;
  uv_timer_t local_80;
  
  puStack_a0 = (uv_loop_t *)0x1d4086;
  puVar2 = uv_default_loop();
  puStack_a0 = (uv_loop_t *)0x1d4093;
  iVar1 = uv_timer_init(puVar2,&local_80);
  local_88 = (long)iVar1;
  local_90 = 0;
  if (local_88 == 0) {
    local_88 = -0x16;
    puStack_a0 = (uv_loop_t *)0x1d40d2;
    iVar1 = uv_timer_start(&local_80,(uv_timer_cb)0x0,100,100);
    local_90 = (long)iVar1;
    if (local_88 != local_90) goto LAB_001d4150;
    puStack_a0 = (uv_loop_t *)0x1d40ea;
    unaff_RBX = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d40fe;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_a0 = (uv_loop_t *)0x1d4108;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_88 = 0;
    puStack_a0 = (uv_loop_t *)0x1d4116;
    puVar2 = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d411e;
    iVar1 = uv_loop_close(puVar2);
    local_90 = (long)iVar1;
    if (local_88 == local_90) {
      puStack_a0 = (uv_loop_t *)0x1d4136;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x1d4150;
    run_test_timer_null_callback_cold_1();
LAB_001d4150:
    puStack_a0 = (uv_loop_t *)0x1d415f;
    run_test_timer_null_callback_cold_2();
  }
  puStack_a0 = (uv_loop_t *)run_test_timer_early_check;
  run_test_timer_null_callback_cold_3();
  pcStack_138 = (code *)0x1d417b;
  puStack_a0 = unaff_RBX;
  puVar2 = uv_default_loop();
  pcStack_138 = (code *)0x1d4183;
  uVar3 = uv_now(puVar2);
  timer_early_check_expected_time = uVar3 + 10;
  pcStack_138 = (code *)0x1d4193;
  puVar2 = uv_default_loop();
  pcStack_138 = (code *)0x1d41a0;
  iVar1 = uv_timer_init(puVar2,&uStack_118);
  lStack_120 = (long)iVar1;
  lStack_128 = 0;
  if (lStack_120 == 0) {
    pcStack_138 = (code *)0x1d41d8;
    iVar1 = uv_timer_start(&uStack_118,timer_early_check_cb,10,0);
    lStack_120 = (long)iVar1;
    lStack_128 = 0;
    if (lStack_120 != 0) goto LAB_001d42cd;
    pcStack_138 = (code *)0x1d41fd;
    puVar2 = uv_default_loop();
    pcStack_138 = (code *)0x1d4207;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_120 = (long)iVar1;
    lStack_128 = 0;
    if (lStack_120 != 0) goto LAB_001d42dc;
    pcStack_138 = (code *)0x1d4233;
    uv_close((uv_handle_t *)&uStack_118,(uv_close_cb)0x0);
    pcStack_138 = (code *)0x1d4238;
    puVar2 = uv_default_loop();
    pcStack_138 = (code *)0x1d4242;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_120 = (long)iVar1;
    lStack_128 = 0;
    if (lStack_120 != 0) goto LAB_001d42eb;
    pcStack_138 = (code *)0x1d4267;
    unaff_RBX = uv_default_loop();
    pcStack_138 = (code *)0x1d427b;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_138 = (code *)0x1d4285;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    lStack_120 = 0;
    pcStack_138 = (code *)0x1d4293;
    puVar2 = uv_default_loop();
    pcStack_138 = (code *)0x1d429b;
    iVar1 = uv_loop_close(puVar2);
    lStack_128 = (long)iVar1;
    if (lStack_120 == lStack_128) {
      pcStack_138 = (code *)0x1d42b3;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_138 = (code *)0x1d42cd;
    run_test_timer_early_check_cold_1();
LAB_001d42cd:
    pcStack_138 = (code *)0x1d42dc;
    run_test_timer_early_check_cold_2();
LAB_001d42dc:
    pcStack_138 = (code *)0x1d42eb;
    run_test_timer_early_check_cold_3();
LAB_001d42eb:
    pcStack_138 = (code *)0x1d42fa;
    run_test_timer_early_check_cold_4();
  }
  pcStack_138 = timer_early_check_cb;
  run_test_timer_early_check_cold_5();
  puStack_150 = (uv_loop_t *)0x1d4312;
  uVar3 = uv_hrtime();
  pcStack_138 = (code *)(uVar3 / 1000000);
  uStack_140 = timer_early_check_expected_time;
  if ((long)timer_early_check_expected_time <= (long)pcStack_138) {
    return (int)pcStack_138;
  }
  puStack_150 = (uv_loop_t *)run_test_timer_no_double_call_once;
  timer_early_check_cb_cold_1();
  puStack_150 = unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&uStack_1c8);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_1c8,timer_check_double_call,10,10);
    if (iVar1 != 0) goto LAB_001d4495;
    uv_sleep(0x14);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_ONCE);
    if (iVar1 != 1) goto LAB_001d44a4;
    if (timer_check_double_call_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d44c2;
    }
  }
  else {
    run_test_timer_no_double_call_once_cold_1();
LAB_001d4495:
    run_test_timer_no_double_call_once_cold_2();
LAB_001d44a4:
    run_test_timer_no_double_call_once_cold_3();
  }
  run_test_timer_no_double_call_once_cold_4();
LAB_001d44c2:
  run_test_timer_no_double_call_once_cold_5();
  timer_check_double_call_called = timer_check_double_call_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(timer_null_callback) {
  uv_timer_t handle;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle));
  ASSERT_EQ(UV_EINVAL, uv_timer_start(&handle, NULL, 100, 100));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}